

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O2

QString * __thiscall
QMakeGlobals::shadowedPath(QString *__return_storage_ptr__,QMakeGlobals *this,QString *fileName)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QStringBuilder<const_QString_&,_QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->source_root).d.size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&fileName->d);
      return __return_storage_ptr__;
    }
  }
  else {
    cVar2 = QString::startsWith((QString *)fileName,(int)this + 0x178);
    if ((cVar2 == '\0') ||
       ((lVar1 = (this->source_root).d.size, (fileName->d).size != lVar1 &&
        ((fileName->d).ptr[lVar1] != L'/')))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
    }
    else {
      QString::mid((longlong)&local_68,(longlong)fileName);
      local_48.b.d.size = local_68.size;
      local_48.b.d.ptr = local_68.ptr;
      local_48.b.d.d = local_68.d;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      local_48.a = &this->build_root;
      QStringBuilder<const_QString_&,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::shadowedPath(const QString &fileName) const
{
    if (source_root.isEmpty())
        return fileName;
    if (fileName.startsWith(source_root)
        && (fileName.size() == source_root.size()
            || fileName.at(source_root.size()) == QLatin1Char('/'))) {
        return build_root + fileName.mid(source_root.size());
    }
    return QString();
}